

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O1

int Option::parseCommandLine(QStringList *args,QMakeCmdLineParserState *state)

{
  QString *pQVar1;
  FILE *pFVar2;
  Data *pDVar3;
  Data *pDVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  ArgumentReturn AVar8;
  iterator iVar9;
  iterator iVar10;
  long lVar11;
  undefined8 *puVar12;
  qsizetype qVar13;
  char16_t *pcVar14;
  int iVar15;
  QStringList *this;
  undefined8 *puVar16;
  long in_FS_OFFSET;
  QFileInfo fi;
  int x;
  int local_130;
  QArrayData *local_120;
  undefined8 *local_118;
  QArrayData *local_108;
  undefined8 *local_100;
  undefined1 *local_f0 [7];
  QString local_b8;
  QString local_98;
  QString local_78 [2];
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  bVar6 = true;
  if ((args->d).size != 0) {
    bVar6 = false;
    do {
      while (bVar6) {
        local_3c = local_3c + -1;
        QFile::setFileName((QString *)output);
        iVar9 = QList<QString>::begin(args);
        lVar11 = (long)local_3c;
        iVar10 = QList<QString>::begin(args);
        QList<QString>::erase(args,iVar9.i + lVar11,iVar10.i + (long)local_3c + 2);
        bVar6 = false;
        if ((args->d).size <= (long)local_3c) {
          bVar6 = true;
          goto LAB_002984ba;
        }
      }
      AVar8 = QMakeGlobals::addCommandLineArguments(globals,state,args,&local_3c);
      if (AVar8 == ArgumentMalformed) {
        parseCommandLine();
        iVar15 = 1;
        local_130 = 5;
LAB_00297c13:
        bVar6 = false;
      }
      else {
        if ((globals->qtconf).d.size != 0) {
          QLibraryInfoPrivate::setQtconfManualPath((QString *)&globals->qtconf);
        }
        if (AVar8 == ArgumentsOk) {
          iVar15 = 4;
          goto LAB_00297c13;
        }
        lVar11 = (long)local_3c;
        pQVar1 = (args->d).ptr;
        local_78[0].d.d = pQVar1[lVar11].d.d;
        local_78[0].d.ptr = pQVar1[lVar11].d.ptr;
        local_78[0].d.size = pQVar1[lVar11].d.size;
        if (&(local_78[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_78[0].d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_78[0].d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        cVar5 = QString::startsWith((QChar)(char16_t)local_78,0x2d);
        if (cVar5 == '\0') {
          if (qmake_mode - QMAKE_SET_PROPERTY < 3) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&prop::properties,prop::properties.d.size,
                       local_78);
            QList<QString>::end(&prop::properties);
            bVar7 = true;
          }
          else {
            local_f0[0] = &DAT_aaaaaaaaaaaaaaaa;
            QFileInfo::QFileInfo((QFileInfo *)local_f0,(QString *)local_78);
            cVar5 = QFileInfo::makeAbsolute();
            if (cVar5 == '\0') {
              QFileInfo::filePath();
              pcVar14 = local_78[0].d.ptr;
              pDVar4 = local_78[0].d.d;
              qVar13 = local_98.d.size;
              pDVar3 = local_98.d.d;
              local_98.d.d = local_78[0].d.d;
              local_78[0].d.d = pDVar3;
              local_78[0].d.ptr = local_98.d.ptr;
              local_98.d.ptr = pcVar14;
              local_98.d.size = local_78[0].d.size;
              local_78[0].d.size = qVar13;
              if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
                }
              }
            }
            if ((qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
              cVar5 = QFileInfo::isDir();
              if (cVar5 == '\0') {
                this = &mkfile::project_files;
                qVar13 = mkfile::project_files.d.size;
LAB_00298015:
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)this,qVar13,local_78);
                QList<QString>::end(this);
                bVar6 = true;
              }
              else {
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = (char16_t *)0x0;
                local_98.d.size = 0;
                local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                detectProjectFile(&local_b8,local_78,&local_98);
                pFVar2 = _stderr;
                bVar6 = local_b8.d.ptr != (char16_t *)0x0;
                if (local_b8.d.ptr == (char16_t *)0x0) {
                  QString::toUtf8_helper((QString *)&local_108);
                  puVar16 = local_100;
                  if (local_100 == (undefined8 *)0x0) {
                    puVar16 = &QByteArray::_empty;
                  }
                  QString::toUtf8_helper((QString *)&local_120);
                  puVar12 = local_118;
                  if (local_118 == (undefined8 *)0x0) {
                    puVar12 = &QByteArray::_empty;
                  }
                  fprintf(pFVar2,
                          "***Cannot detect .pro file in directory \'%s\'.\n\nQMake expects the file \'%s\' or exactly one .pro file in the given directory.\n"
                          ,puVar16,puVar12);
                  if (local_120 != (QArrayData *)0x0) {
                    LOCK();
                    (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_120,1,0x10);
                    }
                  }
                  if (local_108 != (QArrayData *)0x0) {
                    LOCK();
                    (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_108,1,0x10);
                    }
                  }
                  local_130 = 4;
                }
                else {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&mkfile::project_files,
                             mkfile::project_files.d.size,&local_b8);
                  QList<QString>::end(&mkfile::project_files);
                }
                if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              bVar7 = true;
            }
            else {
              if (qmake_mode == QMAKE_GENERATE_PROJECT) {
                this = &projfile::project_dirs;
                qVar13 = projfile::project_dirs.d.size;
                goto LAB_00298015;
              }
              bVar6 = true;
              bVar7 = false;
            }
            QFileInfo::~QFileInfo((QFileInfo *)local_f0);
            if (!bVar6) goto LAB_00298071;
          }
          if (bVar7) goto LAB_00298050;
LAB_00298412:
          bVar6 = false;
          iVar15 = 1;
          local_130 = 5;
        }
        else {
          bVar6 = comparesEqual(local_78,"-d");
          if (bVar6) {
            debug_level = debug_level + 1;
            goto LAB_00297cb8;
          }
          bVar6 = comparesEqual(local_78,"-v");
          if (((bVar6) || (bVar6 = comparesEqual(local_78,"-version"), bVar6)) ||
             (bVar6 = comparesEqual(local_78,"--version"), bVar6)) {
            pFVar2 = _stdout;
            QMakeLibraryInfo::path(&local_b8,3);
            QString::toLatin1_helper_inplace((QString *)&local_98);
            pcVar14 = local_98.d.ptr;
            if (local_98.d.ptr == (char16_t *)0x0) {
              pcVar14 = (char16_t *)&QByteArray::_empty;
            }
            fprintf(pFVar2,"QMake version %s\nUsing Qt version %s in %s\n","3.1","6.10.0",pcVar14);
            if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_130 = 2;
LAB_00298071:
            bVar6 = false;
            iVar15 = 1;
          }
          else {
            bVar7 = comparesEqual(local_78,"-h");
            bVar6 = false;
            if (((bVar7) || (bVar7 = comparesEqual(local_78,"-help"), bVar7)) ||
               (bVar7 = comparesEqual(local_78,"--help"), bVar7)) {
              local_130 = 1;
              iVar15 = 1;
            }
            else {
              bVar6 = comparesEqual(local_78,"-Wall");
              if (bVar6) {
                warn_level = CONCAT31(warn_level._1_3_,0xff);
              }
              else {
                bVar6 = comparesEqual(local_78,"-Wparser");
                if (bVar6) {
                  warn_level = warn_level | 1;
                }
                else {
                  bVar6 = comparesEqual(local_78,"-Wlogic");
                  if (bVar6) {
                    warn_level = warn_level | 2;
                  }
                  else {
                    bVar6 = comparesEqual(local_78,"-Wdeprecated");
                    if (bVar6) {
                      warn_level = warn_level | 4;
                    }
                    else {
                      bVar6 = comparesEqual(local_78,"-Wnone");
                      if (!bVar6) {
                        bVar6 = comparesEqual(local_78,"-r");
                        if ((bVar6) || (bVar6 = comparesEqual(local_78,"-recursive"), bVar6)) {
                          recursive = true;
                        }
                        else {
                          bVar6 = comparesEqual(local_78,"-nr");
                          if ((!bVar6) && (bVar6 = comparesEqual(local_78,"-norecursive"), !bVar6))
                          {
                            bVar7 = comparesEqual(local_78,"-o");
                            bVar6 = true;
                            iVar15 = 0;
                            if ((bVar7) ||
                               (bVar7 = comparesEqual(local_78,"-output"), iVar15 = 0, bVar7))
                            goto LAB_00298420;
                            if ((qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
                              bVar6 = comparesEqual(local_78,"-nodepend");
                              if ((bVar6) || (bVar6 = comparesEqual(local_78,"-nodepends"), bVar6))
                              {
                                mkfile::do_deps = false;
                              }
                              else {
                                bVar6 = comparesEqual(local_78,"-nomoc");
                                if (bVar6) {
                                  mkfile::do_mocs = false;
                                }
                                else {
                                  bVar6 = comparesEqual(local_78,"-nodependheuristics");
                                  if (bVar6) {
                                    mkfile::do_dep_heuristics = false;
                                  }
                                  else {
                                    bVar6 = comparesEqual(local_78,"-E");
                                    if (!bVar6) {
                                      parseCommandLine();
                                      local_130 = 5;
                                      goto LAB_00298071;
                                    }
                                    mkfile::do_preprocess = true;
                                  }
                                }
                              }
                            }
                            else if (qmake_mode == QMAKE_GENERATE_PROJECT) {
                              bVar6 = comparesEqual(local_78,"-nopwd");
                              if (!bVar6) {
                                parseCommandLine();
                                goto LAB_00298412;
                              }
                              projfile::do_pwd = false;
                            }
                            goto LAB_00297cb8;
                          }
                          recursive = false;
                        }
LAB_00298050:
                        bVar6 = false;
                        QList<QString>::removeAt(args,(long)local_3c);
                        iVar15 = 2;
                        goto LAB_00298420;
                      }
                      warn_level = 0;
                    }
                  }
                }
              }
LAB_00297cb8:
              bVar6 = false;
              iVar15 = 0;
            }
          }
        }
LAB_00298420:
        if (&(local_78[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_78[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate(&(local_78[0].d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((iVar15 == 0) || (iVar15 == 4)) {
        local_3c = local_3c + 1;
      }
      else if (iVar15 != 2) goto LAB_002984be;
    } while ((long)local_3c < (args->d).size);
    bVar6 = !bVar6;
  }
LAB_002984ba:
  local_130 = 0;
  if (!bVar6) {
    parseCommandLine();
    local_130 = 5;
  }
LAB_002984be:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_130;
}

Assistant:

int
Option::parseCommandLine(QStringList &args, QMakeCmdLineParserState &state)
{
    enum { ArgNone, ArgOutput } argState = ArgNone;
    int x = 0;
    while (x < args.size()) {
        switch (argState) {
        case ArgOutput:
            Option::output.setFileName(args.at(x--));
            args.erase(args.begin() + x, args.begin() + x + 2);
            argState = ArgNone;
            continue;
        default:
            QMakeGlobals::ArgumentReturn cmdRet = globals->addCommandLineArguments(state, args, &x);
            if (cmdRet == QMakeGlobals::ArgumentMalformed) {
                fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
                return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
            }
            if (!globals->qtconf.isEmpty())
                QLibraryInfoPrivate::setQtconfManualPath(&globals->qtconf);
            if (cmdRet == QMakeGlobals::ArgumentsOk)
                break;
            Q_ASSERT(cmdRet == QMakeGlobals::ArgumentUnknown);
            QString arg = args.at(x);
            if (arg.startsWith(QLatin1Char('-'))) {
                if (arg == "-d") {
                    Option::debug_level++;
                } else if (arg == "-v" || arg == "-version" || arg == "--version") {
                    fprintf(stdout,
                            "QMake version %s\n"
                            "Using Qt version %s in %s\n",
                            QMAKE_VERSION_STR, QT_VERSION_STR,
                            QMakeLibraryInfo::path(QLibraryInfo::LibrariesPath)
                                    .toLatin1()
                                    .constData());
#ifdef QMAKE_OPENSOURCE_VERSION
                    fprintf(stdout, "QMake is Open Source software from The Qt Company Ltd and/or its subsidiary(-ies).\n");
#endif
                    return Option::QMAKE_CMDLINE_BAIL;
                } else if (arg == "-h" || arg == "-help" || arg == "--help") {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE;
                } else if (arg == "-Wall") {
                    Option::warn_level |= WarnAll;
                } else if (arg == "-Wparser") {
                    Option::warn_level |= WarnParser;
                } else if (arg == "-Wlogic") {
                    Option::warn_level |= WarnLogic;
                } else if (arg == "-Wdeprecated") {
                    Option::warn_level |= WarnDeprecated;
                } else if (arg == "-Wnone") {
                    Option::warn_level = WarnNone;
                } else if (arg == "-r" || arg == "-recursive") {
                    Option::recursive = true;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-nr" || arg == "-norecursive") {
                    Option::recursive = false;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-o" || arg == "-output") {
                    argState = ArgOutput;
                } else {
                    if (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                        Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if (arg == "-nodepend" || arg == "-nodepends") {
                            Option::mkfile::do_deps = false;
                        } else if (arg == "-nomoc") {
                            Option::mkfile::do_mocs = false;
                        } else if (arg == "-nodependheuristics") {
                            Option::mkfile::do_dep_heuristics = false;
                        } else if (arg == "-E") {
                            Option::mkfile::do_preprocess = true;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    } else if (Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        if (arg == "-nopwd") {
                            Option::projfile::do_pwd = false;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    }
                }
            } else {
                bool handled = true;
                if(Option::qmake_mode == Option::QMAKE_QUERY_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_SET_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_UNSET_PROPERTY) {
                    Option::prop::properties.append(arg);
                } else {
                    QFileInfo fi(arg);
                    if(!fi.makeAbsolute()) //strange
                        arg = fi.filePath();
                    if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                       Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if(fi.isDir()) {
                            QString singleProFileCandidate;
                            QString proj = detectProjectFile(arg, &singleProFileCandidate);
                            if (proj.isNull()) {
                                fprintf(stderr, "***Cannot detect .pro file in directory '%s'.\n\n"
                                        "QMake expects the file '%s' "
                                        "or exactly one .pro file in the given directory.\n",
                                        qUtf8Printable(arg),
                                        qUtf8Printable(singleProFileCandidate));
                                return Option::QMAKE_CMDLINE_ERROR;
                            }
                            Option::mkfile::project_files.append(proj);
                        } else {
                            Option::mkfile::project_files.append(arg);
                        }
                    } else if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        Option::projfile::project_dirs.append(arg);
                    } else {
                        handled = false;
                    }
                }
                if(!handled) {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                }
                args.removeAt(x);
                continue;
            }
        }
        x++;
    }
    if (argState != ArgNone) {
        fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
        return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
    }
    return Option::QMAKE_CMDLINE_SUCCESS;
}